

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int bitset_container_union_justcard(bitset_container_t *src_1,bitset_container_t *src_2)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  uint uVar5;
  uint32_t c;
  long lVar6;
  ushort uVar7;
  undefined1 auVar12 [12];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar18;
  int iVar21;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  char cVar27;
  undefined1 auVar28 [12];
  byte bVar36;
  char cVar37;
  byte bVar38;
  char cVar39;
  byte bVar40;
  char cVar41;
  byte bVar42;
  char cVar43;
  byte bVar44;
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined4 uVar8;
  undefined6 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [12];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar17 [16];
  undefined1 auVar29 [12];
  undefined1 auVar30 [14];
  undefined1 auVar31 [14];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  
  if (croaring_detect_supported_architectures_buffer == 0x8000) {
    lVar6 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar5 = *(uint *)(lVar6 + 4);
    lVar6 = cpuid_Version_info(1);
    croaring_detect_supported_architectures_buffer =
         (*(uint *)(lVar6 + 0xc) >> 0x11 & 8 |
         uVar5 >> 2 & 0x40 | (uVar5 >> 3 & 4) + (uVar5 & 8) * 4) + (*(uint *)(lVar6 + 0xc) & 2) * 8;
    LOCK();
    UNLOCK();
  }
  if ((croaring_detect_supported_architectures_buffer & 4) != 0) {
    iVar18 = _avx2_bitset_container_union_justcard(src_1,src_2);
    return iVar18;
  }
  lVar6 = 0;
  iVar18 = 0;
  iVar21 = 0;
  do {
    puVar1 = (undefined8 *)((long)src_1->words + lVar6);
    puVar3 = (undefined8 *)((long)src_1->words + lVar6 + 0x10);
    puVar2 = (undefined8 *)((long)src_2->words + lVar6);
    puVar4 = (undefined8 *)((long)src_2->words + lVar6 + 0x10);
    auVar26._8_8_ = *puVar4;
    auVar26._0_8_ = *puVar2;
    auVar32._8_8_ = *puVar3;
    auVar32._0_8_ = *puVar1;
    auVar32 = auVar32 | auVar26;
    auVar25._8_8_ = puVar4[1];
    auVar25._0_8_ = puVar2[1];
    auVar15._8_8_ = puVar3[1];
    auVar15._0_8_ = puVar1[1];
    auVar15 = auVar15 | auVar25;
    auVar22._0_2_ = auVar32._0_2_ >> 1;
    auVar22._2_2_ = auVar32._2_2_ >> 1;
    auVar22._4_2_ = auVar32._4_2_ >> 1;
    auVar22._6_2_ = auVar32._6_2_ >> 1;
    auVar22._8_2_ = auVar32._8_2_ >> 1;
    auVar22._10_2_ = auVar32._10_2_ >> 1;
    auVar22._12_2_ = auVar32._12_2_ >> 1;
    auVar22._14_2_ = auVar32._14_2_ >> 1;
    auVar22 = auVar22 & _DAT_00125130;
    uVar7 = CONCAT11(auVar32[1] - auVar22[1],auVar32[0] - auVar22[0]);
    uVar8 = CONCAT13(auVar32[3] - auVar22[3],CONCAT12(auVar32[2] - auVar22[2],uVar7));
    uVar9 = CONCAT15(auVar32[5] - auVar22[5],CONCAT14(auVar32[4] - auVar22[4],uVar8));
    uVar10 = CONCAT17(auVar32[7] - auVar22[7],CONCAT16(auVar32[6] - auVar22[6],uVar9));
    auVar28._0_10_ = CONCAT19(auVar32[9] - auVar22[9],CONCAT18(auVar32[8] - auVar22[8],uVar10));
    auVar28[10] = auVar32[10] - auVar22[10];
    auVar28[0xb] = auVar32[0xb] - auVar22[0xb];
    auVar30[0xc] = auVar32[0xc] - auVar22[0xc];
    auVar30._0_12_ = auVar28;
    auVar30[0xd] = auVar32[0xd] - auVar22[0xd];
    auVar33[0xe] = auVar32[0xe] - auVar22[0xe];
    auVar33._0_14_ = auVar30;
    auVar33[0xf] = auVar32[0xf] - auVar22[0xf];
    auVar23 = auVar33 & _DAT_00125140;
    auVar34._0_2_ = uVar7 >> 2;
    auVar34._2_2_ = (ushort)((uint)uVar8 >> 0x12);
    auVar34._4_2_ = (ushort)((uint6)uVar9 >> 0x22);
    auVar34._6_2_ = (ushort)((ulong)uVar10 >> 0x32);
    auVar34._8_2_ = (ushort)((unkuint10)auVar28._0_10_ >> 0x42);
    auVar34._10_2_ = auVar28._10_2_ >> 2;
    auVar34._12_2_ = auVar30._12_2_ >> 2;
    auVar34._14_2_ = auVar33._14_2_ >> 2;
    auVar34 = auVar34 & _DAT_00125140;
    cVar27 = auVar34[0] + auVar23[0];
    bVar36 = auVar34[1] + auVar23[1];
    uVar7 = CONCAT11(bVar36,cVar27);
    cVar37 = auVar34[2] + auVar23[2];
    bVar38 = auVar34[3] + auVar23[3];
    uVar8 = CONCAT13(bVar38,CONCAT12(cVar37,uVar7));
    cVar39 = auVar34[4] + auVar23[4];
    bVar40 = auVar34[5] + auVar23[5];
    uVar9 = CONCAT15(bVar40,CONCAT14(cVar39,uVar8));
    cVar41 = auVar34[6] + auVar23[6];
    bVar42 = auVar34[7] + auVar23[7];
    uVar10 = CONCAT17(bVar42,CONCAT16(cVar41,uVar9));
    cVar43 = auVar34[8] + auVar23[8];
    bVar44 = auVar34[9] + auVar23[9];
    auVar29._0_10_ = CONCAT19(bVar44,CONCAT18(cVar43,uVar10));
    auVar29[10] = auVar34[10] + auVar23[10];
    auVar29[0xb] = auVar34[0xb] + auVar23[0xb];
    auVar31[0xc] = auVar34[0xc] + auVar23[0xc];
    auVar31._0_12_ = auVar29;
    auVar31[0xd] = auVar34[0xd] + auVar23[0xd];
    auVar35[0xe] = auVar34[0xe] + auVar23[0xe];
    auVar35._0_14_ = auVar31;
    auVar35[0xf] = auVar34[0xf] + auVar23[0xf];
    auVar24[0] = (char)(uVar7 >> 4) + cVar27;
    auVar24[1] = (bVar36 >> 4) + bVar36;
    auVar24[2] = (char)(ushort)((uint)uVar8 >> 0x14) + cVar37;
    auVar24[3] = (bVar38 >> 4) + bVar38;
    auVar24[4] = (char)(ushort)((uint6)uVar9 >> 0x24) + cVar39;
    auVar24[5] = (bVar40 >> 4) + bVar40;
    auVar24[6] = (char)(ushort)((ulong)uVar10 >> 0x34) + cVar41;
    auVar24[7] = (bVar42 >> 4) + bVar42;
    auVar24[8] = (char)(ushort)((unkuint10)auVar29._0_10_ >> 0x44) + cVar43;
    auVar24[9] = (bVar44 >> 4) + bVar44;
    auVar24[10] = (char)(auVar29._10_2_ >> 4) + auVar29[10];
    auVar24[0xb] = (auVar29[0xb] >> 4) + auVar29[0xb];
    auVar24[0xc] = (char)(auVar31._12_2_ >> 4) + auVar31[0xc];
    auVar24[0xd] = (auVar31[0xd] >> 4) + auVar31[0xd];
    auVar24[0xe] = (char)(auVar35._14_2_ >> 4) + auVar35[0xe];
    auVar24[0xf] = (auVar35[0xf] >> 4) + auVar35[0xf];
    auVar22 = psadbw(auVar24 & _DAT_00125150,(undefined1  [16])0x0);
    auVar19._0_2_ = auVar15._0_2_ >> 1;
    auVar19._2_2_ = auVar15._2_2_ >> 1;
    auVar19._4_2_ = auVar15._4_2_ >> 1;
    auVar19._6_2_ = auVar15._6_2_ >> 1;
    auVar19._8_2_ = auVar15._8_2_ >> 1;
    auVar19._10_2_ = auVar15._10_2_ >> 1;
    auVar19._12_2_ = auVar15._12_2_ >> 1;
    auVar19._14_2_ = auVar15._14_2_ >> 1;
    auVar19 = auVar19 & _DAT_00125130;
    uVar7 = CONCAT11(auVar15[1] - auVar19[1],auVar15[0] - auVar19[0]);
    uVar8 = CONCAT13(auVar15[3] - auVar19[3],CONCAT12(auVar15[2] - auVar19[2],uVar7));
    uVar9 = CONCAT15(auVar15[5] - auVar19[5],CONCAT14(auVar15[4] - auVar19[4],uVar8));
    uVar10 = CONCAT17(auVar15[7] - auVar19[7],CONCAT16(auVar15[6] - auVar19[6],uVar9));
    auVar11._0_10_ = CONCAT19(auVar15[9] - auVar19[9],CONCAT18(auVar15[8] - auVar19[8],uVar10));
    auVar11[10] = auVar15[10] - auVar19[10];
    auVar11[0xb] = auVar15[0xb] - auVar19[0xb];
    auVar13[0xc] = auVar15[0xc] - auVar19[0xc];
    auVar13._0_12_ = auVar11;
    auVar13[0xd] = auVar15[0xd] - auVar19[0xd];
    auVar23[0xe] = auVar15[0xe] - auVar19[0xe];
    auVar23._0_14_ = auVar13;
    auVar23[0xf] = auVar15[0xf] - auVar19[0xf];
    auVar15 = auVar23 & _DAT_00125140;
    auVar16._0_2_ = uVar7 >> 2;
    auVar16._2_2_ = (ushort)((uint)uVar8 >> 0x12);
    auVar16._4_2_ = (ushort)((uint6)uVar9 >> 0x22);
    auVar16._6_2_ = (ushort)((ulong)uVar10 >> 0x32);
    auVar16._8_2_ = (ushort)((unkuint10)auVar11._0_10_ >> 0x42);
    auVar16._10_2_ = auVar11._10_2_ >> 2;
    auVar16._12_2_ = auVar13._12_2_ >> 2;
    auVar16._14_2_ = auVar23._14_2_ >> 2;
    auVar16 = auVar16 & _DAT_00125140;
    cVar27 = auVar16[0] + auVar15[0];
    bVar36 = auVar16[1] + auVar15[1];
    uVar7 = CONCAT11(bVar36,cVar27);
    cVar37 = auVar16[2] + auVar15[2];
    bVar38 = auVar16[3] + auVar15[3];
    uVar8 = CONCAT13(bVar38,CONCAT12(cVar37,uVar7));
    cVar39 = auVar16[4] + auVar15[4];
    bVar40 = auVar16[5] + auVar15[5];
    uVar9 = CONCAT15(bVar40,CONCAT14(cVar39,uVar8));
    cVar41 = auVar16[6] + auVar15[6];
    bVar42 = auVar16[7] + auVar15[7];
    uVar10 = CONCAT17(bVar42,CONCAT16(cVar41,uVar9));
    cVar43 = auVar16[8] + auVar15[8];
    bVar44 = auVar16[9] + auVar15[9];
    auVar12._0_10_ = CONCAT19(bVar44,CONCAT18(cVar43,uVar10));
    auVar12[10] = auVar16[10] + auVar15[10];
    auVar12[0xb] = auVar16[0xb] + auVar15[0xb];
    auVar14[0xc] = auVar16[0xc] + auVar15[0xc];
    auVar14._0_12_ = auVar12;
    auVar14[0xd] = auVar16[0xd] + auVar15[0xd];
    auVar17[0xe] = auVar16[0xe] + auVar15[0xe];
    auVar17._0_14_ = auVar14;
    auVar17[0xf] = auVar16[0xf] + auVar15[0xf];
    auVar20[0] = (char)(uVar7 >> 4) + cVar27;
    auVar20[1] = (bVar36 >> 4) + bVar36;
    auVar20[2] = (char)(ushort)((uint)uVar8 >> 0x14) + cVar37;
    auVar20[3] = (bVar38 >> 4) + bVar38;
    auVar20[4] = (char)(ushort)((uint6)uVar9 >> 0x24) + cVar39;
    auVar20[5] = (bVar40 >> 4) + bVar40;
    auVar20[6] = (char)(ushort)((ulong)uVar10 >> 0x34) + cVar41;
    auVar20[7] = (bVar42 >> 4) + bVar42;
    auVar20[8] = (char)(ushort)((unkuint10)auVar12._0_10_ >> 0x44) + cVar43;
    auVar20[9] = (bVar44 >> 4) + bVar44;
    auVar20[10] = (char)(auVar12._10_2_ >> 4) + auVar12[10];
    auVar20[0xb] = (auVar12[0xb] >> 4) + auVar12[0xb];
    auVar20[0xc] = (char)(auVar14._12_2_ >> 4) + auVar14[0xc];
    auVar20[0xd] = (auVar14[0xd] >> 4) + auVar14[0xd];
    auVar20[0xe] = (char)(auVar17._14_2_ >> 4) + auVar17[0xe];
    auVar20[0xf] = (auVar17[0xf] >> 4) + auVar17[0xf];
    auVar15 = psadbw(auVar20 & _DAT_00125150,(undefined1  [16])0x0);
    iVar18 = auVar15._0_4_ + auVar22._0_4_ + iVar18;
    iVar21 = auVar15._8_4_ + auVar22._8_4_ + iVar21;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0x2000);
  return iVar21 + iVar18;
}

Assistant:

static inline uint32_t croaring_detect_supported_architectures() {
    static _Atomic int buffer = CROARING_UNINITIALIZED;
    if(buffer == CROARING_UNINITIALIZED) {
      buffer = dynamic_croaring_detect_supported_architectures();
    }
    return buffer;
}